

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O0

void multikey_simd_b<unsigned_int>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  value_type_conflict1 vVar1;
  value_type_conflict1 vVar2;
  uchar *puVar3;
  size_t sVar4;
  bool bVar5;
  uint32_t c;
  uint uVar6;
  reference pvVar7;
  ulong local_80;
  size_t i_1;
  size_t bucketindex [3];
  size_t i;
  undefined1 local_50 [8];
  array<unsigned_long,_3UL> bucketsize;
  uint partval;
  uint8_t *oracle_local;
  uchar **sorted_local;
  size_t depth_local;
  size_t N_local;
  uchar **strings_local;
  
  if (N < 0x20) {
    insertion_sort(strings,(int)N,depth);
  }
  else {
    bucketsize._M_elems[2]._4_4_ = pseudo_median<unsigned_int>(strings,N,depth);
    i = 0;
    std::array<unsigned_long,_3UL>::fill((array<unsigned_long,_3UL> *)local_50,&i);
    bucketindex[2] = N - (N & 0xf);
    calculate_bucketsizes_sse<true>
              (strings,bucketindex[2],oracle,bucketsize._M_elems[2]._4_4_,depth);
    for (; bucketindex[2] < N; bucketindex[2] = bucketindex[2] + 1) {
      c = get_char<unsigned_int>(strings[bucketindex[2]],depth);
      uVar6 = get_bucket<unsigned_int>(c,bucketsize._M_elems[2]._4_4_);
      oracle[bucketindex[2]] = (uint8_t)uVar6;
    }
    for (bucketindex[2] = 0; bucketindex[2] < N; bucketindex[2] = bucketindex[2] + 1) {
      pvVar7 = std::array<unsigned_long,_3UL>::operator[]
                         ((array<unsigned_long,_3UL> *)local_50,(ulong)oracle[bucketindex[2]]);
      *pvVar7 = *pvVar7 + 1;
    }
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,0);
    vVar1 = *pvVar7;
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,1);
    vVar2 = *pvVar7;
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,2);
    if (vVar1 + vVar2 + *pvVar7 != N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x166,
                    "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned int]"
                   );
    }
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,0);
    bucketindex[0] = *pvVar7;
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,0);
    vVar1 = *pvVar7;
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,1);
    bucketindex[1] = vVar1 + *pvVar7;
    for (local_80 = 0; local_80 < N; local_80 = local_80 + 1) {
      puVar3 = strings[local_80];
      sVar4 = bucketindex[(ulong)oracle[local_80] - 1];
      bucketindex[(ulong)oracle[local_80] - 1] = sVar4 + 1;
      sorted[sVar4] = puVar3;
    }
    std::copy<unsigned_char**,unsigned_char**>(sorted,sorted + N,strings);
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,0);
    multikey_simd_b<unsigned_int>(strings,*pvVar7,depth,sorted,oracle);
    bVar5 = is_end<unsigned_int>(bucketsize._M_elems[2]._4_4_);
    if (!bVar5) {
      pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,0);
      vVar1 = *pvVar7;
      pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,1);
      multikey_simd_b<unsigned_int>(strings + vVar1,*pvVar7,depth + 4,sorted,oracle);
    }
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,0);
    vVar1 = *pvVar7;
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,1);
    vVar2 = *pvVar7;
    pvVar7 = std::array<unsigned_long,_3UL>::operator[]((array<unsigned_long,_3UL> *)local_50,2);
    multikey_simd_b<unsigned_int>(strings + vVar1 + vVar2,*pvVar7,depth,sorted,oracle);
  }
  return;
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}